

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.cc
# Opt level: O3

void __thiscall
google::protobuf::DescriptorBuilder::
ValidateNamingStyle<google::protobuf::FileDescriptor,google::protobuf::FileDescriptorProto>
          (DescriptorBuilder *this,FileDescriptor *file,FileDescriptorProto *proto)

{
  anon_unknown_24 *this_00;
  FunctionRef<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_()>
  make_error;
  bool bVar1;
  string *in_RCX;
  string_view name;
  string_view element_name;
  string error;
  FileDescriptor *local_70;
  VoidPtr local_68;
  code *pcStack_60;
  undefined1 *local_58;
  undefined8 local_50;
  undefined1 local_48;
  undefined7 uStack_47;
  FileDescriptor **local_38;
  undefined1 **local_30;
  
  this_00 = (anon_unknown_24 *)file->package_->_M_string_length;
  if (this_00 != (anon_unknown_24 *)0x0) {
    local_50 = 0;
    local_48 = 0;
    name._M_str = (char *)&local_58;
    name._M_len = (size_t)(file->package_->_M_dataplus)._M_p;
    local_70 = file;
    local_58 = &local_48;
    bVar1 = anon_unknown_24::IsValidLowerSnakeCaseName(this_00,name,in_RCX);
    if (!bVar1) {
      local_38 = &local_70;
      local_68.obj = &local_38;
      pcStack_60 = absl::lts_20250127::functional_internal::
                   InvokeObject<google::protobuf::DescriptorBuilder::ValidateNamingStyle<google::protobuf::FileDescriptor,google::protobuf::FileDescriptorProto>(google::protobuf::FileDescriptor_const*,google::protobuf::FileDescriptorProto_const&)::__0,std::__cxx11::string>
      ;
      make_error.invoker_ =
           absl::lts_20250127::functional_internal::
           InvokeObject<google::protobuf::DescriptorBuilder::ValidateNamingStyle<google::protobuf::FileDescriptor,google::protobuf::FileDescriptorProto>(google::protobuf::FileDescriptor_const*,google::protobuf::FileDescriptorProto_const&)::__0,std::__cxx11::string>
      ;
      make_error.ptr_.obj = local_68.obj;
      element_name._M_str = (file->name_->_M_dataplus)._M_p;
      element_name._M_len = file->name_->_M_string_length;
      local_30 = &local_58;
      AddError(this,element_name,&proto->super_Message,NAME,make_error);
    }
    if (local_58 != &local_48) {
      operator_delete(local_58,CONCAT71(uStack_47,local_48) + 1);
    }
  }
  return;
}

Assistant:

void DescriptorBuilder::ValidateNamingStyle(const FileDescriptor* file,
                                            const FileDescriptorProto& proto) {
  // Ignore empty packages for style checks.
  if (file->package().empty()) {
    return;
  }
  std::string error;
  if (!IsValidLowerSnakeCaseName(file->package(), &error)) {
    AddError(file->name(), proto, DescriptorPool::ErrorCollector::NAME, [&] {
      return absl::StrCat("Package name ", file->package(), " ", error,
                          kNamingStyleOptOutMessage);
    });
  }
}